

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ply.cc
# Opt level: O2

void __thiscall gvr::PLYWriter::addComment(PLYWriter *this,string *s)

{
  PLYElement *this_00;
  IOException *this_01;
  allocator local_41;
  PLYElement *comment;
  
  if (this->header_complete != true) {
    this_00 = (PLYElement *)operator_new(0x40);
    PLYElement::PLYElement(this_00,s,-1);
    comment = this_00;
    std::vector<gvr::PLYElement_*,_std::allocator<gvr::PLYElement_*>_>::push_back
              (&this->list,&comment);
    return;
  }
  this_01 = (IOException *)__cxa_allocate_exception(0x28);
  std::__cxx11::string::string
            ((string *)&comment,"Creation of ply header has been completed",&local_41);
  gutil::IOException::IOException(this_01,(string *)&comment);
  __cxa_throw(this_01,&gutil::IOException::typeinfo,gutil::Exception::~Exception);
}

Assistant:

void PLYWriter::addComment(const std::string &s)
{
  if (header_complete)
  {
    throw gutil::IOException("Creation of ply header has been completed");
  }

  PLYElement *comment=new PLYElement(s, -1);

  list.push_back(comment);
}